

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::AbstractDOMParser::attDef
          (AbstractDOMParser *this,DTDElementDecl *elemDecl,DTDAttDef *attDef,bool param_3)

{
  DefAttTypes DVar1;
  XMLCh *pXVar2;
  bool bVar3;
  XMLCh toAppend;
  int iVar4;
  undefined4 extraout_var;
  XMLSize_t XVar5;
  XMLBuffer *pXVar6;
  XMLSize_t i;
  XMLSize_t XVar7;
  undefined1 *puVar8;
  
  bVar3 = DOMDocumentTypeImpl::isIntSubsetReading(this->fDocumentType);
  if (!bVar3) {
    return;
  }
  iVar4 = (*(elemDecl->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[7])(elemDecl);
  if ((char)iVar4 == '\0') {
    return;
  }
  pXVar6 = this->fInternalSubset;
  iVar4 = (*(attDef->super_XMLAttDef).super_XSerializable._vptr_XSerializable[5])(attDef);
  XMLBuffer::append(pXVar6,(XMLCh *)CONCAT44(extraout_var,iVar4));
  switch((attDef->super_XMLAttDef).fType) {
  case AttTypes_Min:
    XMLBuffer::append(this->fInternalSubset,L' ');
    pXVar6 = this->fInternalSubset;
    puVar8 = XMLUni::fgCDATAString;
    break;
  case ID:
    XMLBuffer::append(this->fInternalSubset,L' ');
    pXVar6 = this->fInternalSubset;
    puVar8 = (undefined1 *)0x344228;
    break;
  case IDRef:
    XMLBuffer::append(this->fInternalSubset,L' ');
    pXVar6 = this->fInternalSubset;
    puVar8 = XMLUni::fgIDRefString;
    break;
  case IDRefs:
    XMLBuffer::append(this->fInternalSubset,L' ');
    pXVar6 = this->fInternalSubset;
    puVar8 = XMLUni::fgIDRefsString;
    break;
  case Entity:
    XMLBuffer::append(this->fInternalSubset,L' ');
    pXVar6 = this->fInternalSubset;
    puVar8 = XMLUni::fgEntityString;
    break;
  case Entities:
    XMLBuffer::append(this->fInternalSubset,L' ');
    pXVar6 = this->fInternalSubset;
    puVar8 = XMLUni::fgEntitiesString;
    break;
  case NmToken:
    XMLBuffer::append(this->fInternalSubset,L' ');
    pXVar6 = this->fInternalSubset;
    puVar8 = XMLUni::fgNmTokenString;
    break;
  case NmTokens:
    XMLBuffer::append(this->fInternalSubset,L' ');
    pXVar6 = this->fInternalSubset;
    puVar8 = XMLUni::fgNmTokensString;
    break;
  case Notation:
    XMLBuffer::append(this->fInternalSubset,L' ');
    pXVar6 = this->fInternalSubset;
    puVar8 = XMLUni::fgNotationString;
    break;
  case Enumeration:
    XMLBuffer::append(this->fInternalSubset,L' ');
    pXVar2 = (attDef->super_XMLAttDef).fEnumeration;
    XVar5 = XMLString::stringLen(pXVar2);
    if (XVar5 != 0) {
      XMLBuffer::append(this->fInternalSubset,L'(');
      for (XVar7 = 0; XVar5 != XVar7; XVar7 = XVar7 + 1) {
        toAppend = pXVar2[XVar7];
        if (toAppend == L' ') {
          toAppend = L'|';
        }
        XMLBuffer::append(this->fInternalSubset,toAppend);
      }
      XMLBuffer::append(this->fInternalSubset,L')');
    }
  default:
    goto switchD_002d53dd_default;
  }
  XMLBuffer::append(pXVar6,(XMLCh *)puVar8);
switchD_002d53dd_default:
  DVar1 = (attDef->super_XMLAttDef).fDefaultType;
  if (DVar1 == Fixed) {
    puVar8 = XMLUni::fgFixedString;
  }
  else if (DVar1 == Required) {
    puVar8 = XMLUni::fgRequiredString;
  }
  else {
    if (DVar1 != Implied) goto LAB_002d55b4;
    puVar8 = XMLUni::fgImpliedString;
  }
  XMLBuffer::append(this->fInternalSubset,L' ');
  XMLBuffer::append(this->fInternalSubset,(XMLCh *)puVar8);
LAB_002d55b4:
  pXVar2 = (attDef->super_XMLAttDef).fValue;
  if (pXVar2 == (XMLCh *)0x0) {
    return;
  }
  XMLBuffer::append(this->fInternalSubset,L' ');
  XMLBuffer::append(this->fInternalSubset,L'\"');
  XMLBuffer::append(this->fInternalSubset,pXVar2);
  XMLBuffer::append(this->fInternalSubset,L'\"');
  return;
}

Assistant:

void AbstractDOMParser::attDef
(
    const   DTDElementDecl&     elemDecl
    , const DTDAttDef&          attDef
    , const bool
)
{
    if (fDocumentType->isIntSubsetReading())
    {
        if (elemDecl.hasAttDefs())
        {
            fInternalSubset.append(attDef.getFullName());

            // Get the type and display it
            const XMLAttDef::AttTypes type = attDef.getType();
            switch(type)
            {
            case XMLAttDef::CData :
                fInternalSubset.append(chSpace);
                fInternalSubset.append(XMLUni::fgCDATAString);
                break;
            case XMLAttDef::ID :
                fInternalSubset.append(chSpace);
                fInternalSubset.append(XMLUni::fgIDString);
                break;
            case XMLAttDef::IDRef :
                fInternalSubset.append(chSpace);
                fInternalSubset.append(XMLUni::fgIDRefString);
                break;
            case XMLAttDef::IDRefs :
                fInternalSubset.append(chSpace);
                fInternalSubset.append(XMLUni::fgIDRefsString);
                break;
            case XMLAttDef::Entity :
                fInternalSubset.append(chSpace);
                fInternalSubset.append(XMLUni::fgEntityString);
                break;
            case XMLAttDef::Entities :
                fInternalSubset.append(chSpace);
                fInternalSubset.append(XMLUni::fgEntitiesString);
                break;
            case XMLAttDef::NmToken :
                fInternalSubset.append(chSpace);
                fInternalSubset.append(XMLUni::fgNmTokenString);
                break;
            case XMLAttDef::NmTokens :
                fInternalSubset.append(chSpace);
                fInternalSubset.append(XMLUni::fgNmTokensString);
                break;

            case XMLAttDef::Notation :
                fInternalSubset.append(chSpace);
                fInternalSubset.append(XMLUni::fgNotationString);
                break;

            case XMLAttDef::Enumeration :
                {
                    fInternalSubset.append(chSpace);
                    const XMLCh* enumString = attDef.getEnumeration();
                    XMLSize_t length = XMLString::stringLen(enumString);
                    if (length > 0) {

                        fInternalSubset.append(chOpenParen );
                        for(XMLSize_t i=0; i<length; i++) {
                            if (enumString[i] == chSpace)
                                fInternalSubset.append(chPipe);
                            else
                                fInternalSubset.append(enumString[i]);
                        }
                        fInternalSubset.append(chCloseParen);
                    }
                }
                break;
            default:
                // remaining types don't belong to a DTD
                break;
            }
            //get te default types of the attlist
            const XMLAttDef::DefAttTypes def = attDef.getDefaultType();
            switch(def)
            {
            case XMLAttDef::Required :
                fInternalSubset.append(chSpace);
                fInternalSubset.append(XMLUni::fgRequiredString);
                break;
            case XMLAttDef::Implied :
                fInternalSubset.append(chSpace);
                fInternalSubset.append(XMLUni::fgImpliedString);
                break;
            case XMLAttDef::Fixed :
                fInternalSubset.append(chSpace);
                fInternalSubset.append(XMLUni::fgFixedString);
                break;
            default:
                // remaining types don't belong to a DTD
                break;
            }

            const XMLCh* defaultValue = attDef.getValue();
            if (defaultValue != 0) {
                fInternalSubset.append(chSpace);
                fInternalSubset.append(chDoubleQuote);
                fInternalSubset.append(defaultValue);
                fInternalSubset.append(chDoubleQuote);
            }
        }
    }
}